

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

ItemThing * leave_pack(ItemThing *obj,bool newobj,bool all)

{
  ItemThing *local_20;
  ItemThing *nobj;
  bool all_local;
  ItemThing *pIStack_10;
  bool newobj_local;
  ItemThing *obj_local;
  
  local_20 = obj;
  pIStack_10 = obj;
  if ((obj->count < 2) || (all)) {
    last_pick = (ItemThing *)0x0;
    pack_used[obj->packch + -0x61] = false;
    std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::remove
              (&player.pack,(char *)&stack0xfffffffffffffff0);
  }
  else {
    last_pick = obj;
    obj->count = obj->count + -1;
    if (newobj) {
      local_20 = (ItemThing *)operator_new(0x48);
      ItemThing::ItemThing(local_20);
      memcpy(local_20,pIStack_10,0x48);
      local_20->count = 1;
    }
  }
  return local_20;
}

Assistant:

ItemThing * leave_pack(ItemThing *obj, bool newobj, bool all)
{
    ItemThing *nobj;

    nobj = obj;
    if (obj->count > 1 && !all)
    {
        last_pick = obj;
        obj->count--;
        if (newobj)
        {
            nobj = new ItemThing();
            *nobj = *obj;
            nobj->count = 1;
        }
    }
    else
    {
        last_pick = nullptr;
        pack_used[obj->packch - 'a'] = false;
        player.pack.remove(obj);
    }
    return nobj;
}